

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitCommonExpr(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,Reference r)

{
  CStringRef arg0;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  reference pvVar6;
  ExprBase other;
  ExprBase e;
  int in_EDX;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  Error *in_RDI;
  MutCommonExpr MVar7;
  EExpr eexpr;
  bool dvelim;
  MutCommonExpr ce;
  int index;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  Variable in_stack_fffffffffffffb04;
  BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffb08;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffb10;
  size_type in_stack_fffffffffffffb18;
  vector<mp::EExpr,_std::allocator<mp::EExpr>_> *in_stack_fffffffffffffb20;
  size_type in_stack_fffffffffffffb28;
  int *in_stack_fffffffffffffb30;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_fffffffffffffb38;
  undefined2 in_stack_fffffffffffffb3c;
  undefined1 in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  CStringRef msg;
  ExprBase local_2c8 [42];
  LinTerms *in_stack_fffffffffffffe88;
  EExpr *in_stack_fffffffffffffe90;
  BasicCStringRef<char> local_70 [6];
  BasicProblem<mp::BasicProblemParams<int>_> *local_40;
  int local_38;
  BasicProblem<mp::BasicProblemParams<int>_> *local_30;
  int local_28;
  int local_1c;
  Reference local_10 [2];
  
  msg.data_ = (char *)in_RDI;
  pcVar3 = Reference::index(local_10,(char *)in_RSI,in_EDX);
  local_1c = (int)pcVar3;
  (*(in_RSI->
    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ).
    super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor[0x12])();
  MVar7 = BasicProblem<mp::BasicProblemParams<int>_>::common_expr
                    (in_stack_fffffffffffffb10,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  local_40 = MVar7.
             super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_38 = MVar7.
             super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_30 = local_40;
  local_28 = local_38;
  bVar1 = BasicProblem<mp::BasicProblemParams<int>_>::
          BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::is_known((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00));
  if (bVar1) {
    iVar2 = defvarelim(in_RSI);
    bVar1 = true;
    if (iVar2 != 2) {
      iVar2 = defvarelim(in_RSI);
      bVar1 = false;
      if (iVar2 == 1) {
        iVar2 = BasicProblem<mp::BasicProblemParams<int>_>::
                BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                ::position((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                            *)0x3d9147);
        bVar1 = iVar2 != 0;
      }
    }
    iVar2 = local_1c;
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RSI->common_exprs_);
    if ((int)sVar5 <= iVar2) {
      this_00 = &in_RSI->common_exprs_;
      (*(in_RSI->
        super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        ).
        super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        .
        super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
        ._vptr_BasicExprVisitor[0x12])();
      BasicProblem<mp::BasicProblemParams<int>_>::num_common_exprs
                ((BasicProblem<mp::BasicProblemParams<int>_> *)0x3d91ac);
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,in_stack_fffffffffffffb28,(value_type *)in_stack_fffffffffffffb20);
      iVar2 = defvarelim(in_RSI);
      if (iVar2 != 0) {
        std::vector<int,_std::allocator<int>_>::size(&in_RSI->common_exprs_);
        std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::resize
                  (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
      }
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RSI->common_exprs_,(long)local_1c);
    if (*pvVar6 < 0) {
      BasicProblem<mp::BasicProblemParams<int>_>::
      BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
      ::linear_expr((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)0x3d9230);
      ToLinTerms((LinearExpr *)in_RSI);
      EExpr::EExpr(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      LinTerms::~LinTerms((LinTerms *)
                          CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00));
      local_2c8[0].impl_ =
           (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                   BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   ::nonlinear_expr(in_stack_fffffffffffffb08);
      other.impl_ = (Impl *)internal::ExprBase::operator_cast_to_function_pointer(local_2c8);
      if (other.impl_ != (Impl *)0x0) {
        e.impl_ = (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                          BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          ::nonlinear_expr(in_stack_fffffffffffffb08);
        BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
        BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e.impl_,
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_,
                   in_stack_fffffffffffffb04.v);
        Convert2EExpr((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
                      (Expr)e.impl_);
        AlgebraicExpression<mp::QuadAndLinTerms>::add
                  ((AlgebraicExpression<mp::QuadAndLinTerms> *)
                   CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
                   in_stack_fffffffffffffaf8);
        EExpr::~EExpr((EExpr *)0x3d9318);
      }
      if (bVar1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI->common_exprs_,(long)local_1c);
        *pvVar6 = 0;
        std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::operator[]
                  (&in_RSI->common_ee_,(long)local_1c);
        EExpr::operator=((EExpr *)CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
                         (EExpr *)in_stack_fffffffffffffaf8);
      }
      else {
        in_stack_fffffffffffffb04.v =
             Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
                         (EExpr *)in_stack_fffffffffffffaf8);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI->common_exprs_,(long)local_1c);
        *pvVar6 = in_stack_fffffffffffffb04.v;
      }
      EExpr::~EExpr((EExpr *)0x3d940e);
    }
    if (bVar1) {
      std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::operator[]
                (&in_RSI->common_ee_,(long)local_1c);
      EExpr::EExpr((EExpr *)CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
                   (EExpr *)in_stack_fffffffffffffaf8);
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->common_exprs_,(long)local_1c);
      EExpr::EExpr((EExpr *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffb04);
    }
    return (EExpr *)(Error *)msg.data_;
  }
  uVar4 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_70,"Defined variable {} not provided in the input.\nPlease contact AMPL support."
            );
  arg0.data_._4_2_ = in_stack_fffffffffffffb3c;
  arg0.data_._0_4_ = in_stack_fffffffffffffb38;
  arg0.data_._6_1_ = in_stack_fffffffffffffb3e;
  arg0.data_._7_1_ = in_stack_fffffffffffffb3f;
  fmt::format<int>(arg0,in_stack_fffffffffffffb30);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)
             CONCAT44(in_stack_fffffffffffffb04.v,in_stack_fffffffffffffb00),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf8);
  Error::Error(in_RDI,msg,(int)((ulong)uVar4 >> 0x20));
  __cxa_throw(uVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

EExpr VisitCommonExpr(Reference r) {
    const auto index = r.index();
    auto ce = MP_DISPATCH( GetModel() ).common_expr(index);
    MP_ASSERT_ALWAYS(ce.is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    bool dvelim
        = 2==defvarelim()         // always inline
          || (1==defvarelim()
              && ce.position());  // used only 1x. @todo own ref count #153
    if (index >= (int)common_exprs_.size()) {
      assert(index < GetModel().num_common_exprs());
      common_exprs_.resize(
                  GetModel().num_common_exprs(),
                  -1);          // init by -1, "no variable"
      if (defvarelim())
        common_ee_.resize(common_exprs_.size());
    }
    if (common_exprs_[index]<0) {                 // not yet converted
      EExpr eexpr( ToLinTerms(ce.linear_expr()) );
      if (ce.nonlinear_expr())
        eexpr.add( Convert2EExpr(ce.nonlinear_expr()) );
      if (dvelim) {             // provide the eexpr itself
        common_exprs_[index] = 0;
        assert((int)common_ee_.size() > index);
        common_ee_[index] = std::move(eexpr);
      } else                            // convert 2 var
        common_exprs_[index] = Convert2Var(std::move(eexpr));
    }
    if (dvelim)
      return common_ee_[index];
    return EExpr::Variable{ common_exprs_[index] };
  }